

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayIndexedTest::PrepareVAO
          (GetVertexArrayIndexedTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x708))(1,&this->m_vao);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glCreateVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xead);
  (**(code **)(lVar3 + 0xd8))(this->m_vao);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xeb0);
  (**(code **)(lVar3 + 0x6c8))(4,this->m_bo);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glCreateBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xeb3);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_bo[0]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xeb7);
  (**(code **)(lVar3 + 0x19f0))(0,1,0x1400,1,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xeba);
  (**(code **)(lVar3 + 0x610))(0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xebd);
  (**(code **)(lVar3 + 0x18a0))(0,3);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribDivisor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xec0);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_bo[1]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xec4);
  (**(code **)(lVar3 + 0x1958))(1,2,0x1402,2,2);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xec7);
  (**(code **)(lVar3 + 0x610))(1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xeca);
  (**(code **)(lVar3 + 0x18a0))(1,2);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribDivisor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xecd);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_bo[2]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xed1);
  (**(code **)(lVar3 + 0x1898))(2,2);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xed4);
  (**(code **)(lVar3 + 0x18a8))(2,3,0x1406,0,4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribIFormat call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xed7);
  (**(code **)(lVar3 + 0xe0))(2,this->m_bo[2],8,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindVertexBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xeda);
  (**(code **)(lVar3 + 0x610))(2);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xedd);
  (**(code **)(lVar3 + 0x18a0))(2,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribDivisor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xee0);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_bo[3]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xee4);
  (**(code **)(lVar3 + 0x19f0))(3,4,0x8368,0,8,4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xee7);
  (**(code **)(lVar3 + 0x610))(3);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xeea);
  (**(code **)(lVar3 + 0x18a0))(3,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribDivisor call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xeed);
  return;
}

Assistant:

void GetVertexArrayIndexedTest::PrepareVAO()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.genBuffers(4, m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers call failed.");

	/* Attribute 0. */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.vertexAttribPointer(0, 1, GL_BYTE, GL_TRUE, 0, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer call failed.");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.vertexAttribDivisor(0, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribDivisor call failed.");

	/* Attribute 1. */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo[1]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.vertexAttribIPointer(1, 2, GL_SHORT, 2, ((glw::GLchar*)NULL + 2));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer call failed.");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.vertexAttribDivisor(1, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribDivisor call failed.");

	/* Attribute 2. */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo[2]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.vertexAttribBinding(2, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	gl.vertexAttribFormat(2, 3, GL_FLOAT, GL_FALSE, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribIFormat call failed.");

	gl.bindVertexBuffer(2, m_bo[2], 8, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexBuffer call failed.");

	gl.enableVertexAttribArray(2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.vertexAttribDivisor(2, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribDivisor call failed.");

	/* Attribute 3. */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo[3]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.vertexAttribPointer(3, 4, GL_UNSIGNED_INT_2_10_10_10_REV, GL_FALSE, 8, ((glw::GLchar*)NULL + 4));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer call failed.");

	gl.enableVertexAttribArray(3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.vertexAttribDivisor(3, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribDivisor call failed.");
}